

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.hpp
# Opt level: O2

void __thiscall
fmt::impl::counting_ostream<char,_std::char_traits<char>_>::counting_ostream
          (counting_ostream<char,_std::char_traits<char>_> *this,
          basic_ostream<char,_std::char_traits<char>_> *out)

{
  locale local_40;
  locale local_38;
  
  std::ios::ios((ios *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x58);
  (this->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream =
       (_func_int **)&PTR__counting_ostream_0019d2f0;
  *(undefined ***)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x58 =
       &PTR__counting_ostream_0019d318;
  std::ostream::ostream(this,(streambuf *)&PTR_construction_vtable_24__0019d330);
  (this->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream =
       (_func_int **)&PTR__counting_ostream_0019d2f0;
  *(undefined ***)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x58 =
       &PTR__counting_ostream_0019d318;
  counting_ostreambuf<char,_std::char_traits<char>_>::counting_ostreambuf
            ((counting_ostreambuf<char,_std::char_traits<char>_> *)
             &(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x8,
             *(basic_streambuf<char,_std::char_traits<char>_> **)
              (&out->field_0xe8 + (long)out->_vptr_basic_ostream[-3]));
  std::locale::locale(&local_40,(locale *)(&out->field_0xd0 + (long)out->_vptr_basic_ostream[-3]));
  std::ios::imbue(&local_38);
  std::locale::~locale(&local_38);
  std::locale::~locale(&local_40);
  return;
}

Assistant:

counting_ostream(std::basic_ostream<CharT, Traits>& out) :
	    Base(&sbuf), sbuf(*(out.rdbuf())) {
	 /* inherit locale from our base stream */
	 this->imbue(out.getloc());
      }